

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O0

p_rank * __thiscall
dna_string::block_rank(dna_string *this,uint64_t superblock_number,uint64_t block_number)

{
  undefined1 x [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  uint64_t uVar1;
  p_rank *in_RDI;
  p_rank *res;
  __uint128_t b2;
  __uint128_t *chars;
  uint8_t *start;
  p_rank *ppVar2;
  
  x._8_8_ = in_RDI;
  x._0_8_ = in_RDI;
  ppVar2 = in_RDI;
  uVar1 = popcount128((__uint128_t)x);
  in_RDI->A = uVar1;
  x_00._8_8_ = ppVar2;
  x_00._0_8_ = in_RDI;
  uVar1 = popcount128((__uint128_t)x_00);
  in_RDI->C = uVar1;
  x_01._8_8_ = ppVar2;
  x_01._0_8_ = in_RDI;
  uVar1 = popcount128((__uint128_t)x_01);
  in_RDI->G = uVar1;
  x_02._8_8_ = ppVar2;
  x_02._0_8_ = in_RDI;
  uVar1 = popcount128((__uint128_t)x_02);
  in_RDI->T = uVar1;
  return ppVar2;
}

Assistant:

inline p_rank block_rank(uint64_t superblock_number, uint64_t block_number){

		//starting address of the block
		uint8_t* start = data + superblock_number*BYTES_PER_SUPERBLOCK + block_number*BYTES_PER_BLOCK;

		//chars[0..3] contains 1st, 2nd, 3rd bits of the BLOCK_SIZE characters
		__uint128_t* chars = (__uint128_t*)(start);

		__uint128_t b2 = ~chars[2]; //most significant bit

		p_rank res = {

			popcount128(b2 & (~chars[1]) & (~chars[0])),
			popcount128(b2 & (~chars[1]) & (chars[0])),
			popcount128(b2 & (chars[1]) & (~chars[0])),
			popcount128(b2 & (chars[1]) & (chars[0]))

		};

		//assert(check_rank_local(res, superblock_number*SUPERBLOCK_SIZE + block_number*BLOCK_SIZE, block_off));

		return res;

	}